

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

QWidget * __thiscall QDataWidgetMapper::mappedWidgetAt(QDataWidgetMapper *this,int section)

{
  long *plVar1;
  
  plVar1 = *(long **)(*(long *)(this + 8) + 0xa0);
  while( true ) {
    if (plVar1 == *(long **)(*(long *)(this + 8) + 0xa8)) {
      return (QWidget *)0x0;
    }
    if ((int)plVar1[2] == section) break;
    plVar1 = plVar1 + 7;
  }
  if ((*plVar1 != 0) && (*(int *)(*plVar1 + 4) != 0)) {
    return (QWidget *)plVar1[1];
  }
  return (QWidget *)0x0;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }